

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O2

bool QTestResult::report3WayResult
               (bool success,char *failureMessage,void *lhs,void *rhs,
               _func_char_ptr_void_ptr *lhsFormatter,_func_char_ptr_void_ptr *rhsFormatter,
               char *lhsExpression,char *rhsExpression,_func_char_ptr_void_ptr *actualOrderFormatter
               ,_func_char_ptr_void_ptr *expectedOrderFormatter,void *actualOrder,
               void *expectedOrder,char *expectedExpression,char *file,int line)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  tuple<const_char_*,_std::default_delete<const_char[]>_> val2;
  size_t sVar4;
  char *failureMsg;
  long in_FS_OFFSET;
  __uniq_ptr_impl<const_char,_std::default_delete<const_char[]>_> local_10a8;
  __uniq_ptr_impl<const_char,_std::default_delete<const_char[]>_> local_10a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  char msg [4096];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(msg,0xaa,0x1000);
  msg[0] = '\0';
  if (lhsExpression == (char *)0x0) {
    qt_assert("lhsExpression",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2e8);
  }
  if (rhsExpression == (char *)0x0) {
    qt_assert("rhsExpression",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2e9);
  }
  if (expectedExpression == (char *)0x0) {
    qt_assert("expectedExpression",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2ea);
  }
  local_1058.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_1058.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1058._M_dataplus._M_p = &DAT_aaaaaaaaaaaaaaaa;
  local_1058._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1098,lhsExpression,(allocator<char> *)&local_10a0);
  std::operator+(&local_1078,&local_1098," <=> ");
  std::operator+(&local_1058,&local_1078,rhsExpression);
  std::__cxx11::string::~string((string *)&local_1078);
  std::__cxx11::string::~string((string *)&local_1098);
  iVar3 = QTestLog::verboseLevel();
  if (1 < iVar3) {
    snprintf(msg,0x1000,"%s(%s, %s, %s)","QCOMPARE_3WAY",lhsExpression,rhsExpression,
             expectedExpression);
    QTestLog::info(msg,file,line);
  }
  if (success) {
    if (QTest::expectFailMode != 0) {
      snprintf(msg,0x1000,"%s(%s, %s, %s) returned TRUE unexpectedly.","QCOMPARE_3WAY",lhsExpression
               ,rhsExpression,expectedExpression);
    }
    bVar2 = checkStatement(true,msg,file,line);
  }
  else {
    local_1078._M_dataplus._M_p = (*lhsFormatter)(lhs);
    local_1098._M_dataplus._M_p = (*rhsFormatter)(rhs);
    local_10a0._M_t.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (tuple<const_char_*,_std::default_delete<const_char[]>_>)
         (*actualOrderFormatter)(actualOrder);
    val2.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>)
         (*expectedOrderFormatter)(expectedOrder);
    failureMsg = "The result of operator<=>() is not what was expected";
    if (failureMessage != (char *)0x0) {
      failureMsg = failureMessage;
    }
    local_10a8._M_t.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (tuple<const_char_*,_std::default_delete<const_char[]>_>)
         (tuple<const_char_*,_std::default_delete<const_char[]>_>)
         val2.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>.
         super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
    formatFailMessage(msg,0x1000,failureMsg,local_1078._M_dataplus._M_p,local_1098._M_dataplus._M_p,
                      lhsExpression,rhsExpression,ThreeWayCompare);
    sVar4 = strlen(msg);
    formatFailMessage(msg + sVar4,0x1000 - sVar4,"",
                      (char *)local_10a0._M_t.
                              super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>
                              .super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
                      (char *)val2.
                              super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>
                              .super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
                      local_1058._M_dataplus._M_p,expectedExpression,CustomCompare);
    bVar2 = checkStatement(false,msg,file,line);
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)&local_10a8);
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)&local_10a0);
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)&local_1098);
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)&local_1078);
  }
  std::__cxx11::string::~string((string *)&local_1058);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTestResult::report3WayResult(bool success,
                                   const char *failureMessage,
                                   const void *lhs, const void *rhs,
                                   const char *(*lhsFormatter)(const void*),
                                   const char *(*rhsFormatter)(const void*),
                                   const char *lhsExpression, const char *rhsExpression,
                                   const char *(*actualOrderFormatter)(const void *),
                                   const char *(*expectedOrderFormatter)(const void *),
                                   const void *actualOrder, const void *expectedOrder,
                                   const char *expectedExpression,
                                   const char *file, int line)
{
    char msg[maxMsgLen];
    msg[0] = '\0';

    QTEST_ASSERT(lhsExpression);
    QTEST_ASSERT(rhsExpression);
    QTEST_ASSERT(expectedExpression);
    const char *macroName = macroNameForOp(QTest::ComparisonOperation::ThreeWayCompare);
    const std::string actualExpression = std::string(lhsExpression) + " <=> " + rhsExpression;

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "%s(%s, %s, %s)",
                      macroName, lhsExpression, rhsExpression, expectedExpression);
        QTestLog::info(msg, file, line);
    }

    if (success) {
        if (QTest::expectFailMode) {
            std::snprintf(msg, maxMsgLen, "%s(%s, %s, %s) returned TRUE unexpectedly.",
                          macroName, lhsExpression, rhsExpression, expectedExpression);
        }
        return checkStatement(success, msg, file, line);
    }
    const std::unique_ptr<const char[]> lhsStr{lhsFormatter(lhs)};
    const std::unique_ptr<const char[]> rhsStr{rhsFormatter(rhs)};

    const std::unique_ptr<const char[]> actual{actualOrderFormatter(actualOrder)};
    const std::unique_ptr<const char[]> expected{expectedOrderFormatter(expectedOrder)};

    if (!failureMessage)
        failureMessage = failureMessageForOp(QTest::ComparisonOperation::ThreeWayCompare);

    // Left and Right compared parameters of QCOMPARE_3WAY
    formatFailMessage(msg, maxMsgLen, failureMessage,
                      lhsStr.get(), rhsStr.get(),
                      lhsExpression, rhsExpression,
                      QTest::ComparisonOperation::ThreeWayCompare);

    // Actual and Expected results of comparison
    formatFailMessage(msg + strlen(msg), maxMsgLen - strlen(msg), "",
                      actual.get(), expected.get(),
                      actualExpression.c_str(), expectedExpression,
                      QTest::ComparisonOperation::CustomCompare);

    return checkStatement(success, msg, file, line);
}